

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_radix_scatter.cpp
# Opt level: O1

void duckdb::RadixScatterArrayVector
               (Vector *v,UnifiedVectorFormat *vdata,idx_t vcount,SelectionVector *sel,
               idx_t add_count,data_ptr_t *key_locations,bool desc,bool has_null,bool nulls_first,
               idx_t prefix_len,idx_t width,idx_t offset)

{
  data_ptr_t *ppdVar1;
  sel_t *psVar2;
  data_ptr_t pdVar3;
  unsigned_long *puVar4;
  Vector *v_00;
  idx_t vcount_00;
  size_t __n;
  SelectionVector *pSVar5;
  byte *pbVar6;
  byte *pbVar7;
  idx_t iVar8;
  idx_t iVar9;
  ulong uVar10;
  
  v_00 = ArrayVector::GetEntry(v);
  vcount_00 = ArrayType::GetSize(&v->type);
  if (has_null) {
    if (add_count != 0) {
      __n = width - 1;
      iVar9 = 0;
      do {
        iVar8 = iVar9;
        if (sel->sel_vector != (sel_t *)0x0) {
          iVar8 = (idx_t)sel->sel_vector[iVar9];
        }
        psVar2 = vdata->sel->sel_vector;
        if (psVar2 != (sel_t *)0x0) {
          iVar8 = (idx_t)psVar2[iVar8];
        }
        uVar10 = iVar8 + offset;
        ppdVar1 = key_locations + iVar9;
        pdVar3 = *ppdVar1;
        puVar4 = (vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar4 == (unsigned_long *)0x0) || ((puVar4[uVar10 >> 6] >> (uVar10 & 0x3f) & 1) != 0))
        {
          pbVar7 = pdVar3 + 1;
          *ppdVar1 = pbVar7;
          *pdVar3 = nulls_first;
          pSVar5 = FlatVector::IncrementalSelectionVector();
          RowOperations::RadixScatter
                    (v_00,vcount_00,pSVar5,1,ppdVar1,false,true,false,prefix_len,__n,
                     uVar10 * vcount_00);
          if ((desc) && (*ppdVar1 = pbVar7, 1 < (long)width)) {
            do {
              *pbVar7 = ~*pbVar7;
              pbVar7 = *ppdVar1 + 1;
              *ppdVar1 = pbVar7;
            } while (pbVar7 < pdVar3 + width);
          }
        }
        else {
          *ppdVar1 = pdVar3 + 1;
          *pdVar3 = !nulls_first;
          switchD_00570541::default(*ppdVar1,0,__n);
          *ppdVar1 = *ppdVar1 + __n;
        }
        iVar9 = iVar9 + 1;
      } while (iVar9 != add_count);
    }
  }
  else if (add_count != 0) {
    iVar9 = 0;
    do {
      iVar8 = iVar9;
      if (sel->sel_vector != (sel_t *)0x0) {
        iVar8 = (idx_t)sel->sel_vector[iVar9];
      }
      psVar2 = vdata->sel->sel_vector;
      if (psVar2 != (sel_t *)0x0) {
        iVar8 = (idx_t)psVar2[iVar8];
      }
      ppdVar1 = key_locations + iVar9;
      pbVar7 = *ppdVar1;
      pSVar5 = FlatVector::IncrementalSelectionVector();
      RowOperations::RadixScatter
                (v_00,vcount_00,pSVar5,1,ppdVar1,false,true,false,prefix_len,width,
                 (iVar8 + offset) * vcount_00);
      if ((desc) && (*ppdVar1 = pbVar7, 0 < (long)width)) {
        pbVar6 = pbVar7 + width;
        do {
          *pbVar7 = ~*pbVar7;
          pbVar7 = *ppdVar1 + 1;
          *ppdVar1 = pbVar7;
        } while (pbVar7 < pbVar6);
      }
      iVar9 = iVar9 + 1;
    } while (iVar9 != add_count);
  }
  return;
}

Assistant:

void RadixScatterArrayVector(Vector &v, UnifiedVectorFormat &vdata, idx_t vcount, const SelectionVector &sel,
                             idx_t add_count, data_ptr_t *key_locations, const bool desc, const bool has_null,
                             const bool nulls_first, const idx_t prefix_len, idx_t width, const idx_t offset) {
	auto &child_vector = ArrayVector::GetEntry(v);
	auto array_size = ArrayType::GetSize(v.GetType());

	if (has_null) {
		auto &validity = vdata.validity;
		const data_t valid = nulls_first ? 1 : 0;
		const data_t invalid = 1 - valid;

		for (idx_t i = 0; i < add_count; i++) {
			auto idx = sel.get_index(i);
			auto source_idx = vdata.sel->get_index(idx) + offset;
			data_ptr_t &key_location = key_locations[i];
			const data_ptr_t key_location_start = key_location;

			if (validity.RowIsValid(source_idx)) {
				*key_location++ = valid;

				auto array_offset = source_idx * array_size;
				RowOperations::RadixScatter(child_vector, array_size, *FlatVector::IncrementalSelectionVector(), 1,
				                            key_locations + i, false, true, false, prefix_len, width - 1, array_offset);

				// invert bits if desc
				if (desc) {
					// skip over validity byte, handled by nulls first/last
					for (key_location = key_location_start + 1; key_location < key_location_start + width;
					     key_location++) {
						*key_location = ~*key_location;
					}
				}
			} else {
				*key_location++ = invalid;
				memset(key_location, '\0', width - 1);
				key_location += width - 1;
			}
			D_ASSERT(key_location == key_location_start + width);
		}
	} else {
		for (idx_t i = 0; i < add_count; i++) {
			auto idx = sel.get_index(i);
			auto source_idx = vdata.sel->get_index(idx) + offset;
			data_ptr_t &key_location = key_locations[i];
			const data_ptr_t key_location_start = key_location;

			auto array_offset = source_idx * array_size;
			RowOperations::RadixScatter(child_vector, array_size, *FlatVector::IncrementalSelectionVector(), 1,
			                            key_locations + i, false, true, false, prefix_len, width, array_offset);
			// invert bits if desc
			if (desc) {
				for (key_location = key_location_start; key_location < key_location_start + width; key_location++) {
					*key_location = ~*key_location;
				}
			}
			D_ASSERT(key_location == key_location_start + width);
		}
	}
}